

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O3

bool duckdb::TryDecimalStringCast<int,(char)44>
               (char *string_ptr,idx_t string_size,int *result,CastParameters *parameters,
               uint8_t width,uint8_t scale)

{
  bool bVar1;
  IntegerCastData<short> *pIVar2;
  uint uVar3;
  IntegerCastData<short> *pIVar4;
  IntegerCastData<short> *pIVar5;
  IntegerCastData<short> *pIVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  byte bVar10;
  byte bVar11;
  undefined7 uVar14;
  ulong uVar12;
  duckdb *pdVar13;
  uint8_t uVar15;
  byte bVar16;
  uint uVar17;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  int params_2;
  ulong in_R11;
  IntegerCastData<short> *pIVar18;
  IntegerCastData<short> *pIVar19;
  uint params_1;
  uint uVar20;
  string error;
  DecimalCastData<int> local_d8;
  undefined4 local_c8;
  undefined4 local_c4;
  int *local_c0;
  IntegerCastData<short> *local_b8;
  IntegerCastData<short> *local_b0;
  string local_a8;
  uint local_88;
  undefined4 uStack_84;
  undefined8 uStack_80;
  CastParameters *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  params_2 = CONCAT31(in_register_00000089,scale);
  local_d8.result = 0;
  local_d8.digit_count = '\0';
  local_d8.decimal_count = '\0';
  local_d8.round_set = false;
  local_d8.should_round = false;
  local_d8.excessive_decimals = '\0';
  local_d8.exponent_type = NONE;
  local_d8.limit =
       *(StoreType_conflict *)
        (NumericHelper::POWERS_OF_TEN + (CONCAT71(in_register_00000081,width) & 0xffffffff) * 8);
  uVar7 = (uint)width;
  params_1 = (uint)scale;
  uVar20 = (uint)string_size;
  local_d8.width = width;
  local_d8.scale = scale;
  local_78 = parameters;
  if (string_size != 0) {
    uVar8 = 0;
    do {
      bVar10 = string_ptr[uVar8];
      uVar17 = (uint)bVar10;
      if ((4 < uVar17 - 9) && (uVar17 != 0x20)) {
        if (uVar17 == 0x2d) {
          if (string_size - 1 != uVar8) {
            pIVar2 = (IntegerCastData<short> *)(string_size - uVar8);
            uVar17 = uVar7 - params_1;
            pIVar4 = (IntegerCastData<short> *)&DAT_00000001;
            bVar10 = 0;
            local_d8.result = 0;
            goto LAB_00d85d98;
          }
          DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,true>(&local_d8);
          break;
        }
        if (bVar10 == 0x30 && string_size - 1 != uVar8) {
          bVar16 = string_ptr[uVar8 + 1];
          if (bVar16 < 0x62) {
            if ((bVar16 != 0x42) && (bVar16 != 0x58)) goto LAB_00d85e66;
          }
          else if ((bVar16 != 0x62) && (bVar16 != 0x78)) goto LAB_00d85e66;
          if ((string_size - uVar8) - 3 < 0xfffffffffffffffe) break;
        }
        else {
LAB_00d85e66:
          pIVar2 = (IntegerCastData<short> *)(string_size - uVar8);
          pIVar4 = (IntegerCastData<short> *)(ulong)(bVar10 == 0x2b);
          if (pIVar4 < pIVar2) {
            uVar17 = uVar7 - params_1;
            local_d8._6_4_ = 0;
            local_d8.result = 0;
            pIVar5 = pIVar4;
            goto LAB_00d85e96;
          }
        }
        DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,false>(&local_d8);
        break;
      }
      uVar8 = uVar8 + 1;
    } while (string_size != uVar8);
    goto LAB_00d85f43;
  }
  local_88 = 0;
  goto LAB_00d85f7b;
  while( true ) {
    if (string_ptr[(long)(uVar8 + 1 + (long)&pIVar4->result)] == '_') {
      if (((string_size - (long)pIVar4) - 2 == uVar8) ||
         (pIVar4 = pIVar4 + 1, 9 < (byte)((string_ptr + (long)pIVar4)[uVar8] - 0x30U)))
      goto LAB_00d85f3b;
    }
    else {
      pIVar4 = (IntegerCastData<short> *)((long)&pIVar4->result + 1);
    }
    pIVar6 = pIVar4;
    if (pIVar2 <= pIVar4) break;
LAB_00d85d98:
    bVar11 = string_ptr[(long)(uVar8 + (long)&pIVar4->result)];
    bVar16 = bVar11 - 0x30;
    if (9 < bVar16) {
      local_d8._7_3_ = 0;
      local_d8.digit_count = bVar10;
      pIVar5 = pIVar4;
      if (bVar11 != 0x2c) goto LAB_00d862f4;
      pIVar18 = (IntegerCastData<short> *)((long)&pIVar4->result + 1);
      pIVar6 = pIVar18;
      if (pIVar2 <= pIVar18) goto LAB_00d863c7;
      uVar12 = 0;
      local_b8 = (IntegerCastData<short> *)CONCAT44(local_b8._4_4_,(uint)bVar10);
      local_c4 = 0;
      local_c8 = 0;
      uVar17 = 0;
      pIVar5 = pIVar18;
      goto LAB_00d86097;
    }
    if (bVar16 == 0 && local_d8.result == 0) {
      local_d8.result = 0;
    }
    else {
      if ((uVar17 == bVar10) || (bVar10 = bVar10 + 1, local_d8.result < -0xccccccc))
      goto LAB_00d85f3b;
      local_d8.result = local_d8.result * 10 - (uint)bVar16;
    }
    pIVar6 = pIVar2;
    if (~(ulong)pIVar4 + string_size == uVar8) break;
  }
  local_d8._7_3_ = 0;
  local_d8.digit_count = bVar10;
LAB_00d86158:
  local_c0 = result;
  bVar1 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,true>(&local_d8);
  if ((bVar1) && ((IntegerCastData<short> *)&DAT_00000001 < pIVar6)) goto LAB_00d86295;
  goto LAB_00d85f43;
  while( true ) {
    if ((string_ptr + (long)pIVar5)[uVar8 + 1] == '_') {
      if ((string_size - (long)pIVar5) - 2 == uVar8) goto LAB_00d862a1;
      pIVar5 = pIVar5 + 1;
      bVar11 = (string_ptr + (long)pIVar5)[uVar8] - 0x30;
      uVar12 = CONCAT71((int7)((ulong)(string_ptr + (long)pIVar5) >> 8),bVar11);
      if (9 < bVar11) goto LAB_00d862a1;
    }
    else {
      pIVar5 = (IntegerCastData<short> *)((long)&pIVar5->result + 1);
    }
    pIVar6 = pIVar5;
    if (pIVar2 <= pIVar5) break;
LAB_00d86097:
    bVar11 = (string_ptr + (long)pIVar5)[uVar8];
    bVar16 = bVar11 - 0x30;
    uVar15 = (uint8_t)uVar17;
    local_b0 = pIVar18;
    if (9 < bVar16) {
      local_d8.decimal_count = uVar15;
      local_d8.round_set = local_c8._0_1_;
      local_d8.should_round = (bool)(char)local_c4;
      local_c0 = result;
      if (pIVar18 < pIVar5 || (IntegerCastData<short> *)&DAT_00000001 < pIVar4) goto LAB_00d862f4;
      goto LAB_00d85f43;
    }
    if ((uVar15 == scale) && (local_c8._0_1_ == false)) {
      uVar14 = (undefined7)(uVar12 >> 8);
      local_c4 = (undefined4)CONCAT71(uVar14,4 < bVar16);
      local_c8 = (undefined4)CONCAT71(uVar14,1);
    }
    bVar1 = uVar17 + bVar10 < 9;
    if (bVar1) {
      local_d8.result = local_d8.result * 10 - (uint)bVar16;
    }
    bVar16 = uVar15 + bVar1;
    uVar17 = (uint)bVar16;
    uVar12 = ~(ulong)pIVar5 + string_size;
    pIVar6 = pIVar2;
    if (uVar12 == uVar8) break;
  }
  local_d8.decimal_count = bVar16;
  local_d8.round_set = SUB41(local_c8,0);
  local_d8.should_round = (bool)(char)local_c4;
LAB_00d863c7:
  if (((IntegerCastData<short> *)&DAT_00000001 < pIVar4) || (local_c0 = result, pIVar18 < pIVar6))
  goto LAB_00d86158;
  goto LAB_00d85f43;
LAB_00d862f4:
  uVar3 = (uint)bVar11;
  if (bVar11 < 0x20) {
    local_c0 = result;
    if (uVar3 - 9 < 5) {
LAB_00d86309:
      pIVar4 = (IntegerCastData<short> *)((long)&pIVar5->result + 1);
      pIVar6 = pIVar4;
      if (pIVar4 < pIVar2) {
        do {
          if ((4 < (byte)(string_ptr + (long)pIVar4)[uVar8] - 9) &&
             (local_c0 = result, (string_ptr + (long)pIVar4)[uVar8] != 0x20)) goto LAB_00d85f43;
          pIVar4 = (IntegerCastData<short> *)((long)&pIVar4->result + 1);
          pIVar6 = pIVar2;
        } while (pIVar2 != pIVar4);
      }
      goto LAB_00d86158;
    }
  }
  else if ((bVar11 == 0x65) || (uVar3 == 0x45)) {
    local_c0 = result;
    if ((pIVar5 != (IntegerCastData<short> *)&DAT_00000001) &&
       (pIVar4 = (IntegerCastData<short> *)((long)&pIVar5->result + 1), pIVar4 < pIVar2)) {
      local_a8._M_dataplus._M_p._0_2_ = 0;
      pdVar13 = (duckdb *)(string_ptr + (long)pIVar5 + uVar8 + 1);
      pcVar9 = (char *)(~uVar8 + (string_size - (long)pIVar5));
      if (*pdVar13 == (duckdb)0x2d) {
        bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                          (pdVar13,pcVar9,(idx_t)&local_a8,pIVar4,SUB41(uVar17,0));
      }
      else {
        bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                          (pdVar13,pcVar9,(idx_t)&local_a8,pIVar4,SUB41(uVar17,0));
      }
      if (bVar1 != false) {
        bVar1 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<int>,true>
                          (&local_d8,(int)(short)local_a8._M_dataplus._M_p);
        goto LAB_00d8653c;
      }
    }
  }
  else {
    local_c0 = result;
    if (uVar3 == 0x20) goto LAB_00d86309;
  }
  goto LAB_00d85f43;
  while( true ) {
    if (string_ptr[(long)(uVar8 + 1 + (long)&pIVar5->result)] == '_') {
      if (((string_size - (long)pIVar5) - 2 == uVar8) ||
         (pIVar5 = pIVar5 + 1, 9 < (byte)((string_ptr + (long)pIVar5)[uVar8] - 0x30U)))
      goto LAB_00d85f3b;
    }
    else {
      pIVar5 = (IntegerCastData<short> *)((long)&pIVar5->result + 1);
    }
    pIVar19 = pIVar5;
    if (pIVar2 <= pIVar5) break;
LAB_00d85e96:
    bVar10 = (byte)local_d8._6_4_;
    uVar12 = CONCAT71((int7)(in_R11 >> 8),string_ptr[(long)(uVar8 + (long)&pIVar5->result)]);
    uVar3 = (uint)uVar12;
    bVar16 = (byte)(uVar3 - 0x30);
    local_b8 = pIVar4;
    if (9 < bVar16) {
      pIVar18 = pIVar5;
      if (string_ptr[(long)(uVar8 + (long)&pIVar5->result)] != ',') goto LAB_00d86416;
      pIVar6 = (IntegerCastData<short> *)((long)&pIVar5->result + 1);
      pIVar19 = pIVar6;
      if (pIVar2 <= pIVar6) goto LAB_00d864e3;
      local_c4 = 0;
      local_c8 = 0;
      uVar17 = 0;
      pIVar18 = pIVar6;
      goto LAB_00d861c0;
    }
    if (bVar16 == 0 && local_d8.result == 0) {
      local_d8.result = 0;
    }
    else {
      if (uVar17 == local_d8._6_4_) goto LAB_00d85f3b;
      bVar10 = bVar10 + 1;
      local_d8._6_4_ = ZEXT14(bVar10);
      if (0xccccccc < local_d8.result) goto LAB_00d85f3b;
      local_d8.result = (uVar3 - 0x30 & 0xff) + local_d8.result * 10;
    }
    bVar10 = (byte)local_d8._6_4_;
    in_R11 = ~(ulong)pIVar5 + string_size;
    pIVar19 = pIVar2;
    if (in_R11 == uVar8) break;
  }
LAB_00d8627a:
  local_c0 = result;
  bVar1 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,false>(&local_d8);
  if ((bVar1) && (local_b8 < pIVar19)) {
LAB_00d86295:
    *result = local_d8.result;
    return true;
  }
  goto LAB_00d85f43;
LAB_00d862a1:
  local_d8.decimal_count = bVar16;
  local_d8.round_set = SUB41(local_c8,0);
  local_d8.should_round = (bool)(char)local_c4;
  local_c0 = result;
  goto LAB_00d85f43;
LAB_00d86416:
  uVar3 = uVar3 & 0xff;
  if (uVar3 < 0x20) {
    local_c0 = result;
    if (uVar3 - 9 < 5) {
LAB_00d8642b:
      pIVar4 = (IntegerCastData<short> *)((long)&pIVar18->result + 1);
      pIVar19 = pIVar4;
      if (pIVar4 < pIVar2) {
        do {
          if ((4 < (byte)(string_ptr + (long)pIVar4)[uVar8] - 9) &&
             (local_c0 = result, (string_ptr + (long)pIVar4)[uVar8] != 0x20)) goto LAB_00d85f43;
          pIVar4 = (IntegerCastData<short> *)((long)&pIVar4->result + 1);
          pIVar19 = pIVar2;
        } while (pIVar2 != pIVar4);
      }
      goto LAB_00d8627a;
    }
  }
  else if ((uVar3 == 0x65) || (uVar3 == 0x45)) {
    local_c0 = result;
    if ((pIVar18 != pIVar4) &&
       (pIVar4 = (IntegerCastData<short> *)((long)&pIVar18->result + 1), pIVar4 < pIVar2)) {
      local_a8._M_dataplus._M_p._0_2_ = 0;
      pdVar13 = (duckdb *)(string_ptr + (long)pIVar18 + uVar8 + 1);
      pcVar9 = (char *)(~uVar8 + (string_size - (long)pIVar18));
      if (*pdVar13 == (duckdb)0x2d) {
        bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                          (pdVar13,pcVar9,(idx_t)&local_a8,pIVar4,SUB41(uVar17,0));
      }
      else {
        bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                          (pdVar13,pcVar9,(idx_t)&local_a8,pIVar4,SUB41(uVar17,0));
      }
      if (bVar1 != false) {
        bVar1 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<int>,false>
                          (&local_d8,(int)(short)local_a8._M_dataplus._M_p);
LAB_00d8653c:
        result = local_c0;
        if (bVar1 != false) goto LAB_00d86295;
      }
    }
  }
  else {
    local_c0 = result;
    if (uVar3 == 0x20) goto LAB_00d8642b;
  }
  goto LAB_00d85f43;
LAB_00d85f3b:
  local_d8._7_3_ = 0;
  local_d8.digit_count = bVar10;
  local_c0 = result;
  goto LAB_00d85f43;
  while( true ) {
    if ((string_ptr + (long)pIVar18)[uVar8 + 1] == '_') {
      if (((string_size - (long)pIVar18) - 2 == uVar8) ||
         (pIVar18 = pIVar18 + 1, 9 < (byte)((string_ptr + (long)pIVar18)[uVar8] - 0x30U)))
      goto LAB_00d862a1;
    }
    else {
      pIVar18 = (IntegerCastData<short> *)((long)&pIVar18->result + 1);
    }
    pIVar19 = pIVar18;
    if (pIVar2 <= pIVar18) break;
LAB_00d861c0:
    uVar14 = (undefined7)(uVar12 >> 8);
    uVar3 = (uint)CONCAT71(uVar14,(string_ptr + (long)pIVar18)[uVar8]);
    bVar16 = (byte)(uVar3 - 0x30);
    uVar15 = (uint8_t)uVar17;
    local_b0 = pIVar6;
    if (9 < bVar16) {
      local_d8.decimal_count = uVar15;
      local_d8.digit_count = bVar10;
      local_d8.round_set = local_c8._0_1_;
      local_d8.should_round = (bool)(char)local_c4;
      local_c0 = result;
      if (pIVar6 < pIVar18 || pIVar4 < pIVar5) goto LAB_00d86416;
      goto LAB_00d85f43;
    }
    if ((uVar15 == scale) && (local_c8._0_1_ == false)) {
      local_c4 = (undefined4)CONCAT71(uVar14,4 < bVar16);
      local_c8 = (undefined4)CONCAT71(uVar14,1);
    }
    bVar1 = uVar17 + local_d8._6_4_ < 9;
    uVar12 = (ulong)(uint)(local_d8.result * 5);
    if (bVar1) {
      local_d8.result = (uVar3 - 0x30 & 0xff) + local_d8.result * 10;
    }
    bVar16 = uVar15 + bVar1;
    uVar17 = (uint)bVar16;
    pIVar19 = pIVar2;
    if (~(ulong)pIVar18 + string_size == uVar8) break;
  }
  local_d8.decimal_count = bVar16;
  local_d8.digit_count = bVar10;
  local_d8.round_set = SUB41(local_c8,0);
  local_d8.should_round = (bool)(char)local_c4;
LAB_00d864e3:
  if ((pIVar4 < pIVar5) || (local_c0 = result, pIVar6 < pIVar19)) goto LAB_00d8627a;
LAB_00d85f43:
  local_88 = uVar20;
  if (uVar20 < 0xd) {
    uStack_80._4_4_ = 0;
    uStack_84 = 0;
    uStack_80._0_4_ = 0;
    if (uVar20 == 0) {
LAB_00d85f7b:
      uStack_80._4_4_ = 0;
      uStack_80._0_4_ = 0;
      uStack_84 = 0;
      string_size = 0;
    }
    else {
      switchD_015de399::default(&uStack_84,string_ptr,(ulong)(uVar20 & 0xf));
    }
    string_ptr = (char *)&uStack_84;
    uStack_80 = (char *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
  }
  else {
    uStack_84 = *(undefined4 *)string_ptr;
    uStack_80 = string_ptr;
  }
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Could not convert string \"%s\" to DECIMAL(%d,%d)","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,string_ptr,string_ptr + (string_size & 0xffffffff));
  StringUtil::Format<std::__cxx11::string,int,int>
            (&local_a8,(StringUtil *)local_70,&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar7,
             params_1,params_2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  HandleCastError::AssignError(&local_a8,local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT62(local_a8._M_dataplus._M_p._2_6_,(short)local_a8._M_dataplus._M_p) !=
      &local_a8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT62(local_a8._M_dataplus._M_p._2_6_,(short)local_a8._M_dataplus._M_p));
  }
  return false;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, CastParameters &parameters,
                          uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		string_t value(string_ptr, (uint32_t)string_size);
		string error = StringUtil::Format("Could not convert string \"%s\" to DECIMAL(%d,%d)", value.GetString(),
		                                  (int)width, (int)scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = state.result;
	return true;
}